

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

void __thiscall ConditionalExecution::execute(ConditionalExecution *this)

{
  Funcdata *this_00;
  bool bVar1;
  OpCode OVar2;
  reference ppPVar3;
  FlowBlock *inblock;
  _List_iterator<PcodeOp_*> local_50;
  _Self local_48;
  _List_node_base *local_40;
  _List_iterator<PcodeOp_*> local_38;
  _Self local_30;
  _List_node_base *local_28;
  PcodeOp *local_20;
  PcodeOp *op;
  iterator iter;
  ConditionalExecution *this_local;
  
  iter._M_node = (_List_node_base *)this;
  std::_List_iterator<PcodeOp_*>::_List_iterator((_List_iterator<PcodeOp_*> *)&op);
  fixReturnOp(this);
  if ((this->directsplit & 1U) == 0) {
    local_28 = (_List_node_base *)BlockBasic::beginOp(this->iblock);
    op = (PcodeOp *)local_28;
    while( true ) {
      local_30._M_node = (_List_node_base *)BlockBasic::endOp(this->iblock);
      bVar1 = std::operator!=((_Self *)&op,&local_30);
      if (!bVar1) break;
      local_38._M_node =
           (_List_node_base *)
           std::_List_iterator<PcodeOp_*>::operator++((_List_iterator<PcodeOp_*> *)&op,0);
      ppPVar3 = std::_List_iterator<PcodeOp_*>::operator*(&local_38);
      local_20 = *ppPVar3;
      bVar1 = PcodeOp::isBranch(local_20);
      if (!bVar1) {
        doReplacement(this,local_20);
      }
      Funcdata::opDestroy(this->fd,local_20);
    }
    Funcdata::removeFromFlowSplit
              (this->fd,this->iblock,this->posta_outslot != this->camethruposta_slot);
  }
  else {
    adjustDirectMulti(this);
    local_40 = (_List_node_base *)BlockBasic::beginOp(this->iblock);
    op = (PcodeOp *)local_40;
    while( true ) {
      local_48._M_node = (_List_node_base *)BlockBasic::endOp(this->iblock);
      bVar1 = std::operator!=((_Self *)&op,&local_48);
      if (!bVar1) break;
      local_50._M_node =
           (_List_node_base *)
           std::_List_iterator<PcodeOp_*>::operator++((_List_iterator<PcodeOp_*> *)&op,0);
      ppPVar3 = std::_List_iterator<PcodeOp_*>::operator*(&local_50);
      local_20 = *ppPVar3;
      OVar2 = PcodeOp::code(local_20);
      if (OVar2 == CPUI_MULTIEQUAL) {
        doReplacement(this,local_20);
        Funcdata::opDestroy(this->fd,local_20);
      }
    }
    this_00 = this->fd;
    inblock = FlowBlock::getIn(&this->iblock->super_FlowBlock,this->camethruposta_slot);
    Funcdata::switchEdge(this_00,inblock,this->iblock,&this->posta_block->super_FlowBlock);
  }
  return;
}

Assistant:

void ConditionalExecution::execute(void)

{
  list<PcodeOp *>::iterator iter;
  PcodeOp *op;

  fixReturnOp();		// Patch any data-flow thru to CPUI_RETURN
  if (!directsplit) {
    iter = iblock->beginOp();
    while(iter != iblock->endOp()) {
      op = *iter++;
      if (!op->isBranch())
	doReplacement(op);	// Remove all read refs of op
      fd->opDestroy(op);	// Then destroy op
    }
    fd->removeFromFlowSplit(iblock,(posta_outslot != camethruposta_slot));
  }
  else {
    adjustDirectMulti();
    iter = iblock->beginOp();
    while(iter != iblock->endOp()) {
      op = *iter++;
      if (op->code() == CPUI_MULTIEQUAL) { // Only adjust MULTIEQUALs
	doReplacement(op);
	fd->opDestroy(op);
      }
      // Branch stays, other operations stay
    }
    fd->switchEdge(iblock->getIn(camethruposta_slot),iblock,posta_block);
  }
}